

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetFunctionSetTypeName(ExpressionContext *ctx,IntrusiveList<TypeHandle> types)

{
  void *__src;
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  ExpressionContext *local_58;
  TypeHandle *arg_1;
  char *pos;
  char *name;
  TypeHandle *arg;
  uint nameLength;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> types_local;
  TypeHandle *__s;
  
  types_local.head = types.tail;
  ctx_local = (ExpressionContext *)types.head;
  bVar1 = IntrusiveList<TypeHandle>::empty((IntrusiveList<TypeHandle> *)&ctx_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!types.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x10e,
                  "InplaceStr GetFunctionSetTypeName(ExpressionContext &, IntrusiveList<TypeHandle>)"
                 );
  }
  arg._4_4_ = 0;
  for (name = (char *)ctx_local; name != (char *)0x0; name = *(char **)(name + 8)) {
    uVar2 = InplaceStr::length((InplaceStr *)(*(long *)name + 0x10));
    iVar3 = 0;
    if (*(long *)(name + 8) != 0) {
      iVar3 = 4;
    }
    arg._4_4_ = uVar2 + iVar3 + arg._4_4_;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(arg._4_4_ + 1U));
  __s = (TypeHandle *)CONCAT44(extraout_var,iVar3);
  arg_1 = __s;
  for (local_58 = ctx_local; local_58 != (ExpressionContext *)0x0;
      local_58 = (ExpressionContext *)local_58->code) {
    __src = *(void **)(*(long *)local_58 + 0x10);
    uVar2 = InplaceStr::length((InplaceStr *)(*(long *)local_58 + 0x10));
    memcpy(arg_1,__src,(ulong)uVar2);
    uVar2 = InplaceStr::length((InplaceStr *)(*(long *)local_58 + 0x10));
    arg_1 = (TypeHandle *)((long)&arg_1->type + (ulong)uVar2);
    if (local_58->code != (char *)0x0) {
      strcpy((char *)arg_1," or ");
      arg_1 = (TypeHandle *)((long)&arg_1->type + 4);
    }
  }
  *(undefined1 *)&arg_1->type = 0;
  sVar4 = strlen((char *)__s);
  if (sVar4 + 1 == (ulong)(arg._4_4_ + 1U)) {
    InplaceStr::InplaceStr((InplaceStr *)&types_local.tail,(char *)__s);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x129,
                "InplaceStr GetFunctionSetTypeName(ExpressionContext &, IntrusiveList<TypeHandle>)")
  ;
}

Assistant:

InplaceStr GetFunctionSetTypeName(ExpressionContext &ctx, IntrusiveList<TypeHandle> types)
{
	assert(!types.empty());

	unsigned nameLength = 0;

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? unsigned(strlen(" or ")) : 0);

	nameLength += 1;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
	{
		memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
		{
			strcpy(pos, " or ");
			pos += strlen(" or ");
		}
	}

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}